

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StorageReaderTests.cpp
# Opt level: O0

int testStorageReaderTestsDataOffset(void)

{
  string *psVar1;
  uint64_t uVar2;
  ostream *poVar3;
  string local_60;
  StorageReader local_40;
  StorageReader reader;
  AutoDeleteTempFile tempfile;
  
  MILBlob::TestUtil::MakeStorageTempFileWith3Records();
  psVar1 = MILBlob::TestUtil::AutoDeleteTempFile::GetFilename_abi_cxx11_
                     ((AutoDeleteTempFile *)&reader);
  std::__cxx11::string::string((string *)&local_60,(string *)psVar1);
  MILBlob::Blob::StorageReader::StorageReader(&local_40,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  uVar2 = MILBlob::Blob::StorageReader::GetDataOffset(&local_40,0x40);
  if (uVar2 == 0x80) {
    uVar2 = MILBlob::Blob::StorageReader::GetDataSize(&local_40,0x40);
    if (uVar2 == 5) {
      uVar2 = MILBlob::Blob::StorageReader::GetDataOffset(&local_40,0xc0);
      if (uVar2 == 0x100) {
        uVar2 = MILBlob::Blob::StorageReader::GetDataSize(&local_40,0xc0);
        if (uVar2 == 8) {
          uVar2 = MILBlob::Blob::StorageReader::GetDataOffset(&local_40,0x140);
          if (uVar2 == 0x180) {
            uVar2 = MILBlob::Blob::StorageReader::GetDataSize(&local_40,0x140);
            if (uVar2 == 0x10) {
              tempfile._36_4_ = 0;
            }
            else {
              poVar3 = std::operator<<((ostream *)&std::cout,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/StorageReaderTests.cpp"
                                      );
              poVar3 = std::operator<<(poVar3,":");
              poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x133);
              poVar3 = std::operator<<(poVar3,": error: ");
              poVar3 = std::operator<<(poVar3,"(uint64_t(16)) == (reader.GetDataSize(320))");
              poVar3 = std::operator<<(poVar3," was false, expected true.");
              std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
              tempfile._36_4_ = 1;
            }
          }
          else {
            poVar3 = std::operator<<((ostream *)&std::cout,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/StorageReaderTests.cpp"
                                    );
            poVar3 = std::operator<<(poVar3,":");
            poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x132);
            poVar3 = std::operator<<(poVar3,": error: ");
            poVar3 = std::operator<<(poVar3,"(uint64_t(384)) == (reader.GetDataOffset(320))");
            poVar3 = std::operator<<(poVar3," was false, expected true.");
            std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
            tempfile._36_4_ = 1;
          }
        }
        else {
          poVar3 = std::operator<<((ostream *)&std::cout,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/StorageReaderTests.cpp"
                                  );
          poVar3 = std::operator<<(poVar3,":");
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x12e);
          poVar3 = std::operator<<(poVar3,": error: ");
          poVar3 = std::operator<<(poVar3,"(uint64_t(8)) == (reader.GetDataSize(192))");
          poVar3 = std::operator<<(poVar3," was false, expected true.");
          std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
          tempfile._36_4_ = 1;
        }
      }
      else {
        poVar3 = std::operator<<((ostream *)&std::cout,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/StorageReaderTests.cpp"
                                );
        poVar3 = std::operator<<(poVar3,":");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x12d);
        poVar3 = std::operator<<(poVar3,": error: ");
        poVar3 = std::operator<<(poVar3,"(uint64_t(256)) == (reader.GetDataOffset(192))");
        poVar3 = std::operator<<(poVar3," was false, expected true.");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        tempfile._36_4_ = 1;
      }
    }
    else {
      poVar3 = std::operator<<((ostream *)&std::cout,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/StorageReaderTests.cpp"
                              );
      poVar3 = std::operator<<(poVar3,":");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x129);
      poVar3 = std::operator<<(poVar3,": error: ");
      poVar3 = std::operator<<(poVar3,"(uint64_t(5)) == (reader.GetDataSize(64))");
      poVar3 = std::operator<<(poVar3," was false, expected true.");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      tempfile._36_4_ = 1;
    }
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/StorageReaderTests.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x128);
    poVar3 = std::operator<<(poVar3,": error: ");
    poVar3 = std::operator<<(poVar3,"(uint64_t(128)) == (reader.GetDataOffset(64))");
    poVar3 = std::operator<<(poVar3," was false, expected true.");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    tempfile._36_4_ = 1;
  }
  MILBlob::Blob::StorageReader::~StorageReader(&local_40);
  MILBlob::TestUtil::AutoDeleteTempFile::~AutoDeleteTempFile((AutoDeleteTempFile *)&reader);
  return tempfile._36_4_;
}

Assistant:

int testStorageReaderTestsDataOffset()
{
    auto tempfile = TestUtil::MakeStorageTempFileWith3Records();

    StorageReader reader(tempfile.GetFilename());

    {  // read data offset for uint8_t weights from metadata 1
        ML_ASSERT_EQ(uint64_t(128), reader.GetDataOffset(64));
        ML_ASSERT_EQ(uint64_t(5), reader.GetDataSize(64));
    }

    {  // read data offset for Fp16 weights from metadata 2
        ML_ASSERT_EQ(uint64_t(256), reader.GetDataOffset(192));
        ML_ASSERT_EQ(uint64_t(8), reader.GetDataSize(192));
    }

    {  // read data offset for float weights from metadata 3
        ML_ASSERT_EQ(uint64_t(384), reader.GetDataOffset(320));
        ML_ASSERT_EQ(uint64_t(16), reader.GetDataSize(320));
    }

    return 0;
}